

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_containers.h
# Opt level: O2

ThreadData * __thiscall
density_tests::
aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>::ThreadData>
::allocate(aligned_allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>::ThreadData>
           *this,size_t i_count)

{
  ThreadData *pTVar1;
  
  pTVar1 = (ThreadData *)density::aligned_allocate(i_count * 0x1440,0x40,0);
  return pTVar1;
}

Assistant:

TYPE * allocate(std::size_t i_count)
        {
            return static_cast<TYPE *>(
              density::aligned_allocate(i_count * sizeof(TYPE), alignof(TYPE)));
        }